

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O2

void __thiscall ManchesterAnalyzer::SetupResults(ManchesterAnalyzer *this)

{
  ManchesterAnalyzerResults *this_00;
  
  this_00 = (ManchesterAnalyzerResults *)operator_new(0x20);
  ManchesterAnalyzerResults::ManchesterAnalyzerResults(this_00,this,(this->mSettings)._M_ptr);
  std::auto_ptr<ManchesterAnalyzerResults>::reset(&this->mResults,this_00);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void ManchesterAnalyzer::SetupResults()
{
    mResults.reset( new ManchesterAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mInputChannel );
}